

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O3

TopLevelScriptLoadFunctionBodyResolveInfo * __thiscall
TTD::EventLog::AddScriptLoad
          (EventLog *this,FunctionBody *fb,ModuleID moduleId,uint64 sourceContextId,byte *source,
          uint32 sourceLen,LoadScriptFlag loadFlag)

{
  uint32 uVar1;
  uint32 uVar2;
  uint32 uVar3;
  uint uVar4;
  TopLevelScriptLoadFunctionBodyResolveInfo *fbInfo;
  
  fbInfo = UnorderedArrayList<TTD::NSSnapValues::TopLevelScriptLoadFunctionBodyResolveInfo,_512UL>::
           NextOpenEntry(&this->m_loadedTopLevelScripts);
  uVar1 = UnorderedArrayList<TTD::NSSnapValues::TopLevelScriptLoadFunctionBodyResolveInfo,_512UL>::
          Count(&this->m_loadedTopLevelScripts);
  uVar2 = UnorderedArrayList<TTD::NSSnapValues::TopLevelNewFunctionBodyResolveInfo,_128UL>::Count
                    (&this->m_newFunctionTopLevelScripts);
  uVar3 = UnorderedArrayList<TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo,_128UL>::Count
                    (&this->m_evalTopLevelScripts);
  NSSnapValues::ExtractTopLevelLoadedFunctionBodyInfo
            (fbInfo,fb,uVar1 + uVar2 + uVar3,moduleId,sourceContextId,
             SUB41((loadFlag & LoadScriptFlag_Utf8Source) >> 6,0),source,sourceLen,loadFlag,
             &this->m_miscSlabAllocator);
  uVar4 = ((fb->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
          m_sourceInfoId + 1;
  if (uVar4 < this->m_sourceInfoCount) {
    uVar4 = this->m_sourceInfoCount;
  }
  this->m_sourceInfoCount = uVar4;
  return fbInfo;
}

Assistant:

const NSSnapValues::TopLevelScriptLoadFunctionBodyResolveInfo* EventLog::AddScriptLoad(Js::FunctionBody* fb, Js::ModuleID moduleId, uint64 sourceContextId, const byte* source, uint32 sourceLen, LoadScriptFlag loadFlag)
    {
        NSSnapValues::TopLevelScriptLoadFunctionBodyResolveInfo* fbInfo = this->m_loadedTopLevelScripts.NextOpenEntry();
        uint32 fCount = (this->m_loadedTopLevelScripts.Count() + this->m_newFunctionTopLevelScripts.Count() + this->m_evalTopLevelScripts.Count());
        bool isUtf8 = ((loadFlag & LoadScriptFlag_Utf8Source) == LoadScriptFlag_Utf8Source);

        NSSnapValues::ExtractTopLevelLoadedFunctionBodyInfo(fbInfo, fb, fCount, moduleId, sourceContextId, isUtf8, source, sourceLen, loadFlag, this->m_miscSlabAllocator);
        this->m_sourceInfoCount = max(this->m_sourceInfoCount, fb->GetUtf8SourceInfo()->GetSourceInfoId() + 1);

        return fbInfo;
    }